

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.h
# Opt level: O1

void __thiscall
wabt::TypeChecker::PrintStackIfFailed<wabt::Type,wabt::Type,wabt::Type>
          (TypeChecker *this,Result result,char *desc,Type args,Type args_1,Type args_2)

{
  initializer_list<wabt::Type> __l;
  Type local_54;
  Type local_50;
  Type local_4c;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_48;
  allocator_type local_29;
  
  if (result.enum_ == Error) {
    __l._M_len = 3;
    __l._M_array = &local_54;
    local_54 = args;
    local_50 = args_1;
    local_4c = args_2;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_48,__l,&local_29);
    PrintStackIfFailed(this,(Result)0x1,desc,&local_48);
    if (local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void PrintStackIfFailed(Result result, const char* desc, Args... args) {
    // Minor optimzation, check result before constructing the vector to pass
    // to the other overload of PrintStackIfFailed.
    if (Failed(result)) {
      PrintStackIfFailed(result, desc, {args...});
    }
  }